

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparison_simplification.cpp
# Opt level: O2

void __thiscall
duckdb::ComparisonSimplificationRule::ComparisonSimplificationRule
          (ComparisonSimplificationRule *this,ExpressionRewriter *rewriter)

{
  _Head_base<0UL,_duckdb::ExpressionMatcher_*,_false> _Var1;
  _Head_base<0UL,_duckdb::ComparisonExpressionMatcher_*,_false> _Var2;
  pointer pCVar3;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::ComparisonExpressionMatcher_*,_false> local_28;
  ExpressionMatcher *local_20;
  _Head_base<0UL,_duckdb::ExpressionMatcher_*,_false> local_18;
  
  (this->super_Rule).rewriter = rewriter;
  (this->super_Rule).root.
  super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl = (ExpressionMatcher *)0x0
  ;
  (this->super_Rule)._vptr_Rule = (_func_int **)&PTR__Rule_02792318;
  make_uniq<duckdb::ComparisonExpressionMatcher>();
  pCVar3 = unique_ptr<duckdb::ComparisonExpressionMatcher,_std::default_delete<duckdb::ComparisonExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::ComparisonExpressionMatcher,_std::default_delete<duckdb::ComparisonExpressionMatcher>,_true>
                         *)&local_28);
  make_uniq<duckdb::FoldableConstantMatcher>();
  local_18._M_head_impl = local_20;
  local_20 = (ExpressionMatcher *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
              *)&pCVar3->matchers,
             (unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)&local_18);
  if (local_18._M_head_impl != (ExpressionMatcher *)0x0) {
    (*(local_18._M_head_impl)->_vptr_ExpressionMatcher[1])();
  }
  local_18._M_head_impl = (ExpressionMatcher *)0x0;
  if (local_20 != (ExpressionMatcher *)0x0) {
    (**(code **)(*(long *)local_20 + 8))();
  }
  pCVar3 = unique_ptr<duckdb::ComparisonExpressionMatcher,_std::default_delete<duckdb::ComparisonExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::ComparisonExpressionMatcher,_std::default_delete<duckdb::ComparisonExpressionMatcher>,_true>
                         *)&local_28);
  _Var2._M_head_impl = local_28._M_head_impl;
  pCVar3->policy = SOME;
  local_28._M_head_impl = (ComparisonExpressionMatcher *)0x0;
  _Var1._M_head_impl =
       (this->super_Rule).root.
       super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
       .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl;
  (this->super_Rule).root.
  super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl =
       &(_Var2._M_head_impl)->super_ExpressionMatcher;
  if (_Var1._M_head_impl != (ExpressionMatcher *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_ExpressionMatcher + 8))();
    if (local_28._M_head_impl != (ComparisonExpressionMatcher *)0x0) {
      (*((local_28._M_head_impl)->super_ExpressionMatcher)._vptr_ExpressionMatcher[1])();
    }
  }
  return;
}

Assistant:

ComparisonSimplificationRule::ComparisonSimplificationRule(ExpressionRewriter &rewriter) : Rule(rewriter) {
	// match on a ComparisonExpression that has a ConstantExpression as a check
	auto op = make_uniq<ComparisonExpressionMatcher>();
	op->matchers.push_back(make_uniq<FoldableConstantMatcher>());
	op->policy = SetMatcher::Policy::SOME;
	root = std::move(op);
}